

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_jpg_file(ConstPtr *image,string *filename,int quality)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  FILE *__stream;
  invalid_argument *this;
  FileException *this_00;
  int *piVar5;
  char *msg;
  Exception *pEVar6;
  allocator local_350 [8];
  jpeg_error_mgr jerr;
  uint local_154;
  _Alloc_hider local_60;
  JSAMPROW row_pointer;
  FILE *local_40;
  allocator local_31;
  
  peVar4 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.c | 2U) != 3) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&jerr.first_addon_message,"Invalid image color space",local_350);
    util::Exception::Exception(pEVar6,(string *)&jerr.first_addon_message);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    msg = strerror(*piVar5);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  jerr._160_8_ = jpeg_std_error(local_350);
  piVar5 = &jerr.first_addon_message;
  jpeg_CreateCompress(piVar5,0x50,0x248);
  jpeg_stdio_dest(piVar5,__stream);
  peVar4 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  uVar1 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  iVar2 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  local_40 = __stream;
  if ((iVar2 != 1) && (iVar2 != 3)) {
    jpeg_destroy_compress(&jerr.first_addon_message);
    fclose(__stream);
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffa0,"Invalid image color space",&local_31);
    util::Exception::Exception(pEVar6,(string *)&stack0xffffffffffffffa0);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  jpeg_set_defaults(piVar5);
  jpeg_set_quality(piVar5,quality,1);
  jpeg_start_compress(piVar5,1);
  peVar4 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  iVar2 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  iVar3 = (peVar4->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  while (local_154 < uVar1) {
    local_60._M_p =
         (pointer)((peVar4->super_TypedImageBase<unsigned_char>).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + local_154 * iVar2 * iVar3);
    jpeg_write_scanlines(piVar5,&stack0xffffffffffffffa0,1);
  }
  jpeg_finish_compress(&jerr.first_addon_message);
  jpeg_destroy_compress(&jerr.first_addon_message);
  fclose(local_40);
  return;
}

Assistant:

void
save_jpg_file (ByteImage::ConstPtr image, std::string const& filename, int quality)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    if (image->channels() != 1 && image->channels() != 3)
        throw util::Exception("Invalid image color space");

    FILE* fp = std::fopen(filename.c_str(), "wb");
    if (!fp)
        throw util::FileException(filename, std::strerror(errno));

    struct jpeg_compress_struct cinfo;
    struct jpeg_error_mgr jerr;

    /* Setup error handler and info object. */
    cinfo.err = jpeg_std_error(&jerr);
    jpeg_create_compress(&cinfo);
    jpeg_stdio_dest(&cinfo, fp);

    /* Specify image dimensions. */
    cinfo.image_width = image->width();
    cinfo.image_height = image->height();
    cinfo.input_components = image->channels();
    switch (image->channels())
    {
        case 1: cinfo.in_color_space = JCS_GRAYSCALE; break;
        case 3: cinfo.in_color_space = JCS_RGB; break;
        default:
        {
            jpeg_destroy_compress(&cinfo);
            std::fclose(fp);
            throw util::Exception("Invalid image color space");
        }
    }

    /* Set default compression parameters. */
    jpeg_set_defaults(&cinfo);
    jpeg_set_quality(&cinfo, quality, TRUE);
    jpeg_start_compress(&cinfo, TRUE);

    ByteImage::ImageData const& data = image->get_data();
    int row_stride = image->width() * image->channels();
    while (cinfo.next_scanline < cinfo.image_height)
    {
        JSAMPROW row_pointer = const_cast<JSAMPROW>(
            &data[cinfo.next_scanline * row_stride]);
        jpeg_write_scanlines(&cinfo, &row_pointer, 1);
    }
    jpeg_finish_compress(&cinfo);
    jpeg_destroy_compress(&cinfo);
    std::fclose(fp);
}